

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<int>::QList(QList<int> *this,qsizetype size)

{
  long in_RSI;
  QArrayDataPointer<int> *in_RDI;
  QArrayDataPointer<int> *unaff_retaddr;
  QArrayDataPointer<int> *newSize;
  
  newSize = in_RDI;
  QArrayDataPointer<int>::QArrayDataPointer
            (&this->d,size,(qsizetype)unaff_retaddr,(AllocationOption)((ulong)in_RDI >> 0x20));
  if (in_RSI != 0) {
    QArrayDataPointer<int>::operator->(in_RDI);
    QArrayDataPointer<int>::appendInitialize(unaff_retaddr,(qsizetype)newSize);
  }
  return;
}

Assistant:

explicit QList(qsizetype size)
        : d(size)
    {
        if (size)
            d->appendInitialize(size);
    }